

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

bool StartIndexBackgroundSync(NodeContext *node)

{
  pointer ppBVar1;
  pointer ppCVar2;
  string original;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar6;
  Chainstate *pCVar7;
  ChainstateManager *this;
  Chainstate *pCVar8;
  CBlockIndex **ppCVar9;
  char *args;
  pointer ppBVar10;
  ChainstateManager *pCVar11;
  CBlockIndex *upper_block;
  pointer ppBVar12;
  long in_FS_OFFSET;
  CBlockIndex *start_block;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  string older_index_name;
  BlockManager *this_00;
  CChain *this_01;
  ChainstateManager *this_02;
  Chainstate *pCVar13;
  allocator<char> local_119;
  ChainstateManager *local_118;
  unique_lock<std::recursive_mutex> local_110;
  string local_100 [32];
  bilingual_str local_e0;
  IndexSummary local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  puVar6 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp"
                      ,0x7e2,"StartIndexBackgroundSync","node.chainman");
  this = (puVar6->_M_t).
         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
         super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_a0,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp",
             0x7e3,false);
  pCVar7 = ChainstateManager::GetChainstateForIndexing(this);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_a0);
  this_01 = &pCVar7->m_chain;
  ppBVar1 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_00 = &this->m_blockman;
  bVar4 = false;
  pCVar11 = (ChainstateManager *)node;
  this_02 = this;
  for (ppBVar12 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; bVar5 = (byte)this, ppBVar12 != ppBVar1;
      ppBVar12 = ppBVar12 + 1) {
    BaseIndex::GetSummary(&local_a0,*ppBVar12);
    if (local_a0.synced != true) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_e0,&cs_main,"::cs_main"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp"
                 ,0x7eb,false);
      this = (ChainstateManager *)
             ::node::BlockManager::LookupBlockIndex(this_00,&local_a0.best_block_hash);
      bVar3 = CChain::Contains(this_01,(CBlockIndex *)this);
      if (!bVar3) {
        this = (ChainstateManager *)CChain::FindFork(this_01,(CBlockIndex *)this);
      }
      if (((bool)(this == (ChainstateManager *)0x0 | ~bVar4)) ||
         (*(int *)&this->m_best_invalid < *(int *)&pCVar11->m_best_invalid)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_58,&local_a0.name);
        bVar4 = true;
        pCVar11 = this;
        if (this == (ChainstateManager *)0x0) {
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&local_e0);
          std::__cxx11::string::~string((string *)&local_a0);
          pCVar11 = (ChainstateManager *)0x0;
          goto LAB_0015f3b4;
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&local_e0);
    }
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if (bVar4) {
LAB_0015f3b4:
    bVar5 = (byte)this;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_110,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp",
               0x7fa,false);
    pCVar13 = pCVar7;
    local_118 = pCVar11;
    if (pCVar11 == (ChainstateManager *)0x0) {
      pCVar8 = ChainstateManager::ActiveChainstate(this_02);
      ppCVar2 = (pCVar8->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pCVar8->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
          ._M_impl.super__Vector_impl_data._M_finish == ppCVar2) {
        local_118 = (ChainstateManager *)0x0;
      }
      else {
        local_118 = (ChainstateManager *)*ppCVar2;
      }
    }
    ppCVar2 = (pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar2 ==
        (pCVar7->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      upper_block = (CBlockIndex *)0x0;
    }
    else {
      upper_block = ppCVar2[-1];
    }
    args = "StartIndexBackgroundSync";
    ppCVar9 = inline_assertion_check<true,CBlockIndex_const*&>
                        ((CBlockIndex **)&local_118,
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp"
                         ,0x7fd,"StartIndexBackgroundSync","start_block");
    bVar4 = ::node::BlockManager::CheckBlockDataAvailability(this_00,upper_block,*ppCVar9);
    if (!bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,
                 "%s best block of the index goes beyond pruned data. Please disable the index or reindex (which will download the whole blockchain again)"
                 ,&local_119);
      original._M_string_length = (size_type)this_01;
      original._M_dataplus._M_p = (pointer)this_00;
      original.field_2._M_allocated_capacity = (size_type)this_02;
      original.field_2._8_8_ = pCVar13;
      Untranslated(&local_e0,original);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)&local_a0,(tinyformat *)&local_e0,(bilingual_str *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      bVar5 = InitError((bilingual_str *)&local_a0);
      bilingual_str::~bilingual_str((bilingual_str *)&local_a0);
      bilingual_str::~bilingual_str(&local_e0);
      std::__cxx11::string::~string(local_100);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_110);
    if (!bVar4) goto LAB_0015f506;
  }
  ppBVar12 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppBVar1 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppBVar10 = ppBVar1;
    if (ppBVar10 == ppBVar12) goto LAB_0015f4fd;
    bVar4 = BaseIndex::StartBackgroundSync(*ppBVar10);
    ppBVar1 = ppBVar10 + 1;
  } while (bVar4);
  bVar5 = 0;
LAB_0015f4fd:
  bVar5 = bVar5 | ppBVar10 == ppBVar12;
LAB_0015f506:
  std::__cxx11::string::~string((string *)&local_58);
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_38._M_p) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool StartIndexBackgroundSync(NodeContext& node)
{
    // Find the oldest block among all indexes.
    // This block is used to verify that we have the required blocks' data stored on disk,
    // starting from that point up to the current tip.
    // indexes_start_block='nullptr' means "start from height 0".
    std::optional<const CBlockIndex*> indexes_start_block;
    std::string older_index_name;
    ChainstateManager& chainman = *Assert(node.chainman);
    const Chainstate& chainstate = WITH_LOCK(::cs_main, return chainman.GetChainstateForIndexing());
    const CChain& index_chain = chainstate.m_chain;

    for (auto index : node.indexes) {
        const IndexSummary& summary = index->GetSummary();
        if (summary.synced) continue;

        // Get the last common block between the index best block and the active chain
        LOCK(::cs_main);
        const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(summary.best_block_hash);
        if (!index_chain.Contains(pindex)) {
            pindex = index_chain.FindFork(pindex);
        }

        if (!indexes_start_block || !pindex || pindex->nHeight < indexes_start_block.value()->nHeight) {
            indexes_start_block = pindex;
            older_index_name = summary.name;
            if (!pindex) break; // Starting from genesis so no need to look for earlier block.
        }
    };

    // Verify all blocks needed to sync to current tip are present.
    if (indexes_start_block) {
        LOCK(::cs_main);
        const CBlockIndex* start_block = *indexes_start_block;
        if (!start_block) start_block = chainman.ActiveChain().Genesis();
        if (!chainman.m_blockman.CheckBlockDataAvailability(*index_chain.Tip(), *Assert(start_block))) {
            return InitError(strprintf(Untranslated("%s best block of the index goes beyond pruned data. Please disable the index or reindex (which will download the whole blockchain again)"), older_index_name));
        }
    }

    // Start threads
    for (auto index : node.indexes) if (!index->StartBackgroundSync()) return false;
    return true;
}